

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

long Curl_timeleft(SessionHandle *data,timeval *nowp,_Bool duringconnect)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  undefined7 in_register_00000011;
  long lVar5;
  timeval newer;
  
  lVar5 = (data->set).timeout;
  bVar1 = 0 < lVar5;
  cVar2 = bVar1;
  if (((int)CONCAT71(in_register_00000011,duringconnect) != 0) &&
     (cVar2 = bVar1 + '\x02', (data->set).connecttimeout < 1)) {
    cVar2 = bVar1;
  }
  if (cVar2 != '\x01') {
    if (cVar2 == '\x03') {
      lVar4 = (data->set).connecttimeout;
      if (lVar4 <= lVar5) {
        lVar5 = lVar4;
      }
    }
    else if (cVar2 == '\x02') {
      lVar5 = (data->set).connecttimeout;
    }
    else {
      lVar5 = 300000;
      if (!duringconnect) {
        return 0;
      }
    }
  }
  if (nowp == (timeval *)0x0) {
    newer = curlx_tvnow();
  }
  else {
    newer = *nowp;
  }
  lVar3 = curlx_tvdiff(newer,(data->progress).t_startsingle);
  lVar4 = -1;
  if (lVar5 - lVar3 != 0) {
    lVar4 = lVar5 - lVar3;
  }
  return lVar4;
}

Assistant:

long Curl_timeleft(struct SessionHandle *data,
                   struct timeval *nowp,
                   bool duringconnect)
{
  int timeout_set = 0;
  long timeout_ms = duringconnect?DEFAULT_CONNECT_TIMEOUT:0;
  struct timeval now;

  /* if a timeout is set, use the most restrictive one */

  if(data->set.timeout > 0)
    timeout_set |= 1;
  if(duringconnect && (data->set.connecttimeout > 0))
    timeout_set |= 2;

  switch (timeout_set) {
  case 1:
    timeout_ms = data->set.timeout;
    break;
  case 2:
    timeout_ms = data->set.connecttimeout;
    break;
  case 3:
    if(data->set.timeout < data->set.connecttimeout)
      timeout_ms = data->set.timeout;
    else
      timeout_ms = data->set.connecttimeout;
    break;
  default:
    /* use the default */
    if(!duringconnect)
      /* if we're not during connect, there's no default timeout so if we're
         at zero we better just return zero and not make it a negative number
         by the math below */
      return 0;
    break;
  }

  if(!nowp) {
    now = Curl_tvnow();
    nowp = &now;
  }

  /* subtract elapsed time */
  timeout_ms -= Curl_tvdiff(*nowp, data->progress.t_startsingle);
  if(!timeout_ms)
    /* avoid returning 0 as that means no timeout! */
    return -1;

  return timeout_ms;
}